

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

int ossl_i2d_X25519_PUBKEY(ECX_KEY *a,uchar **pp)

{
  EVP_PKEY *pkey;
  uchar **in_RSI;
  char *in_RDI;
  int ret;
  EVP_PKEY *pktmp;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 0;
  }
  else {
    pkey = EVP_PKEY_new();
    if (pkey == (EVP_PKEY *)0x0) {
      ERR_new();
      ERR_set_debug(in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)pkey);
      ERR_set_error(0xd,0xc0100,(char *)0x0);
      local_4 = -1;
    }
    else {
      EVP_PKEY_assign(pkey,0x40a,in_RDI);
      local_4 = i2d_PUBKEY(pkey,in_RSI);
      (pkey->pkey).ptr = (char *)0x0;
      EVP_PKEY_free(pkey);
    }
  }
  return local_4;
}

Assistant:

int ossl_i2d_X25519_PUBKEY(const ECX_KEY *a, unsigned char **pp)
{
    EVP_PKEY *pktmp;
    int ret;

    if (a == NULL)
        return 0;
    if ((pktmp = EVP_PKEY_new()) == NULL) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
        return -1;
    }
    (void)EVP_PKEY_assign(pktmp, EVP_PKEY_X25519, (ECX_KEY *)a);
    ret = i2d_PUBKEY(pktmp, pp);
    pktmp->pkey.ptr = NULL;
    EVP_PKEY_free(pktmp);
    return ret;
}